

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O0

void __thiscall CMapLayers::CMapLayers(CMapLayers *this,int Type)

{
  undefined4 in_ESI;
  CComponent *in_RDI;
  
  CComponent::CComponent(in_RDI);
  in_RDI->_vptr_CComponent = (_func_int **)&PTR__CMapLayers_00298e68;
  array<CEnvPoint,_allocator_default<CEnvPoint>_>::array
            ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)0x16ef4d);
  array<CEnvPoint,_allocator_default<CEnvPoint>_>::array
            ((array<CEnvPoint,_allocator_default<CEnvPoint>_> *)0x16ef5d);
  *(undefined4 *)&in_RDI[2]._vptr_CComponent = in_ESI;
  in_RDI[1].m_pClient = (CGameClient *)0x0;
  in_RDI[1]._vptr_CComponent = (_func_int **)0x0;
  *(undefined4 *)((long)&in_RDI[2]._vptr_CComponent + 4) = 0;
  return;
}

Assistant:

CMapLayers::CMapLayers(int Type)
{
	m_Type = Type;
	m_pMenuMap = 0;
	m_pMenuLayers = 0;
	m_OnlineStartTime = 0;
}